

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-logging.cc
# Opt level: O2

Result __thiscall
wabt::BinaryReaderLogging::OnBrTableExpr
          (BinaryReaderLogging *this,Index num_targets,Index *target_depths,
          Index default_target_depth)

{
  Enum EVar1;
  ulong uVar2;
  
  WriteIndent(this);
  Stream::Writef(this->stream_,"OnBrTableExpr(num_targets: %u, depths: [",(ulong)num_targets);
  for (uVar2 = 0; num_targets != uVar2; uVar2 = uVar2 + 1) {
    Stream::Writef(this->stream_,"%u",(ulong)target_depths[uVar2]);
    if (num_targets - 1 != uVar2) {
      Stream::Writef(this->stream_,", ");
    }
  }
  Stream::Writef(this->stream_,"], default: %u)\n",(ulong)default_target_depth);
  EVar1 = (*this->reader_->_vptr_BinaryReaderDelegate[0x4d])
                    (this->reader_,(ulong)num_targets,target_depths,(ulong)default_target_depth);
  return (Result)EVar1;
}

Assistant:

Result BinaryReaderLogging::OnBrTableExpr(Index num_targets,
                                          Index* target_depths,
                                          Index default_target_depth) {
  LOGF("OnBrTableExpr(num_targets: %" PRIindex ", depths: [", num_targets);
  for (Index i = 0; i < num_targets; ++i) {
    LOGF_NOINDENT("%" PRIindex, target_depths[i]);
    if (i != num_targets - 1) {
      LOGF_NOINDENT(", ");
    }
  }
  LOGF_NOINDENT("], default: %" PRIindex ")\n", default_target_depth);
  return reader_->OnBrTableExpr(num_targets, target_depths,
                                default_target_depth);
}